

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::peer_connection::incoming_allowed_fast(peer_connection *this,piece_index_t index)

{
  peer_connection_hot_members *this_00;
  uint uVar1;
  __uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_> _Var2;
  _Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> this_01;
  char cVar3;
  bool bVar4;
  download_priority_t dVar5;
  int iVar6;
  ulong uVar7;
  _List_node_base *p_Var8;
  shared_ptr<libtorrent::aux::torrent> t;
  value_type local_3c;
  __shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  this_00 = &this->super_peer_connection_hot_members;
  local_3c.m_val = index.m_val;
  ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_38)
  ;
  peer_log(this,incoming_message,"ALLOWED_FAST","%d",index.m_val);
  p_Var8 = (_List_node_base *)&this->m_extensions;
  do {
    p_Var8 = (((_List_base<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
                *)&p_Var8->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var8 == (_List_node_base *)&this->m_extensions) {
      iVar6 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[1])(this);
      if ((char)iVar6 != '\0') break;
      if (index.m_val < 0) {
        peer_log(this,incoming_message,"INVALID_ALLOWED_FAST","%d",index.m_val);
        break;
      }
      if (((((local_38._M_ptr)->super_torrent_hot_members).m_torrent_file.
            super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          m_files).m_piece_length < 1) {
LAB_00226a82:
        ::std::
        vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
        ::push_back(&this->m_allowed_fast,&local_3c);
        _Var2._M_t.super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
        super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
             (this_00->m_have_piece).super_bitfield.m_buf.
             super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t;
        if ((_Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>)
            _Var2._M_t.super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
            super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl == (uint *)0x0) {
          iVar6 = 0;
        }
        else {
          iVar6 = *(int *)_Var2._M_t.
                          super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                          .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
        }
        if ((((local_3c.m_val < iVar6) &&
             (bVar4 = bitfield::get_bit((bitfield *)this_00,local_3c.m_val), bVar4)) &&
            (bVar4 = torrent::has_piece_passed(local_38._M_ptr,(piece_index_t)local_3c.m_val),
            !bVar4)) &&
           (((0 < ((((local_38._M_ptr)->super_torrent_hot_members).m_torrent_file.
                    super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->m_files).m_piece_length &&
             (this_01._M_head_impl =
                   ((local_38._M_ptr)->super_torrent_hot_members).m_picker._M_t.
                   super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                   .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl,
             this_01._M_head_impl != (piece_picker *)0x0)) &&
            (dVar5 = piece_picker::piece_priority
                               (this_01._M_head_impl,(piece_index_t)local_3c.m_val),
            dVar5.m_val != '\0')))) {
          torrent::peer_is_interesting(local_38._M_ptr,this);
        }
      }
      else {
        _Var2._M_t.super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
        super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
             (this_00->m_have_piece).super_bitfield.m_buf.
             super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t;
        if ((_Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>)
            _Var2._M_t.super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
            super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl == (uint *)0x0) {
          uVar7 = 0;
        }
        else {
          uVar1 = *(uint *)_Var2._M_t.
                           super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                           .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
          uVar7 = (ulong)uVar1;
          if (index.m_val < (int)uVar1) {
            bVar4 = torrent::have_piece(local_38._M_ptr,index);
            if (!bVar4) goto LAB_00226a82;
            break;
          }
        }
        peer_log(this,incoming_message,"INVALID_ALLOWED_FAST","%d s: %d",index.m_val,uVar7);
      }
      break;
    }
    cVar3 = (**(code **)(*(long *)p_Var8[1]._M_next + 0x88))();
  } while (cVar3 == '\0');
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  return;
}

Assistant:

void peer_connection::incoming_allowed_fast(piece_index_t const index)
	{
		TORRENT_ASSERT(is_single_thread());
		INVARIANT_CHECK;

		auto t = m_torrent.lock();
		TORRENT_ASSERT(t);

#ifndef TORRENT_DISABLE_LOGGING
		peer_log(peer_log_alert::incoming_message, "ALLOWED_FAST", "%d"
			, static_cast<int>(index));
#endif

#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto const& e : m_extensions)
		{
			if (e->on_allowed_fast(index)) return;
		}
#endif
		if (is_disconnecting()) return;

		if (index < piece_index_t(0))
		{
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::incoming_message, "INVALID_ALLOWED_FAST"
				, "%d", static_cast<int>(index));
#endif
			return;
		}

		if (t->valid_metadata())
		{
			if (index >= m_have_piece.end_index())
			{
#ifndef TORRENT_DISABLE_LOGGING
				peer_log(peer_log_alert::incoming_message, "INVALID_ALLOWED_FAST"
					, "%d s: %d", static_cast<int>(index), m_have_piece.size());
#endif
				return;
			}

			// if we already have the piece, we can
			// ignore this message
			if (t->have_piece(index))
				return;
		}

		// if we don't have the metadata, we'll verify
		// this piece index later
		m_allowed_fast.push_back(index);

		// if the peer has the piece and we want
		// to download it, request it
		if (index < m_have_piece.end_index()
			&& m_have_piece[index]
			&& !t->has_piece_passed(index)
			&& t->valid_metadata()
			&& t->has_picker()
			&& t->picker().piece_priority(index) > dont_download)
		{
			t->peer_is_interesting(*this);
		}
	}